

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O1

int webrtc::ConvertFloatToByteArray(float value,uint8_t *out_bytes)

{
  size_t i;
  long lVar1;
  
  if (out_bytes != (uint8_t *)0x0) {
    lVar1 = 0;
    do {
      out_bytes[lVar1] = SUB41(value,0);
      value = (float)((uint)value >> 8);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    return 0;
  }
  return -1;
}

Assistant:

int ConvertFloatToByteArray(float value, uint8_t out_bytes[4]) {
  if (!out_bytes) {
    return -1;
  }

  uint32_t binary_value = bit_cast<uint32_t>(value);
  for (size_t i = 0; i < 4; ++i) {
    out_bytes[i] = binary_value;
    binary_value >>= 8;
  }

  return 0;
}